

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OMFormat.cc
# Opt level: O2

char * OpenMesh::IO::OMFormat::as_string(Entity e)

{
  if ((e < (Entity_Halfedge|Entity_Mesh)) && ((0x57U >> (e & 0x1f) & 1) != 0)) {
    return &DAT_001c5eac + *(int *)(&DAT_001c5eac + (ulong)e * 4);
  }
  std::operator<<((ostream *)&std::clog,"as_string(Chunk::Entity): Invalid value!");
  return (char *)0x0;
}

Assistant:

const char *as_string(Chunk::Entity e)
  {
    switch(e)
    {    
      case Chunk::Entity_Vertex:   return "Vertex";
      case Chunk::Entity_Mesh:     return "Mesh";
      case Chunk::Entity_Edge:     return "Edge";
      case Chunk::Entity_Halfedge: return "Halfedge";
      case Chunk::Entity_Face:     return "Face";
      default:
	std::clog << "as_string(Chunk::Entity): Invalid value!";
    }
    return NULL;
  }